

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

void UpdateSizeHint(BrotliEncoderState *s,size_t available_in)

{
  uint64_t uVar1;
  uint local_30;
  uint32_t total;
  uint32_t limit;
  uint64_t tail;
  uint64_t delta;
  size_t available_in_local;
  BrotliEncoderState *s_local;
  
  if ((s->params).size_hint == 0) {
    uVar1 = UnprocessedInputSize(s);
    if (((uVar1 < 0x40000000) && (available_in < 0x40000000)) && (uVar1 + available_in < 0x40000000)
       ) {
      local_30 = (int)uVar1 + (int)available_in;
    }
    else {
      local_30 = 0x40000000;
    }
    (s->params).size_hint = (ulong)local_30;
  }
  return;
}

Assistant:

static void UpdateSizeHint(BrotliEncoderState* s, size_t available_in) {
  if (s->params.size_hint == 0) {
    uint64_t delta = UnprocessedInputSize(s);
    uint64_t tail = available_in;
    uint32_t limit = 1u << 30;
    uint32_t total;
    if ((delta >= limit) || (tail >= limit) || ((delta + tail) >= limit)) {
      total = limit;
    } else {
      total = (uint32_t)(delta + tail);
    }
    s->params.size_hint = total;
  }
}